

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O3

void __thiscall covenant::CFG::get_alphabet_min_and_max(CFG *this,int *min,int *max)

{
  int iVar1;
  bool bVar2;
  pointer pvVar3;
  pointer pvVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  pointer pPVar8;
  ulong uVar9;
  ulong uVar10;
  int *piVar11;
  int *piVar12;
  ulong uVar13;
  vector<int,_std::allocator<int>_> terminals;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  int local_74;
  int *local_70;
  vector<int,_std::allocator<int>_> local_68;
  int *local_50;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_48;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  pvVar3 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = 0;
  local_70 = min;
  local_50 = max;
  do {
    pPVar8 = pvVar3[uVar10].
             super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         ((long)&pvVar3[uVar10].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data + 8) != pPVar8) {
      uVar9 = 0;
      uVar13 = 1;
      do {
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  (&local_48,
                   (this->rules).
                   super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + pPVar8[uVar9].rule);
        if ((long)local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (long)local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl
                  .super__Vector_impl_data._M_start == 4) {
          if (((local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
                super__Vector_impl_data._M_start)->x & 1U) == 0) {
            local_74 = (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                        _M_impl.super__Vector_impl_data._M_start)->x >> 1;
            if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (&local_68,
                         (iterator)
                         local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_74);
            }
            else {
              *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish = local_74;
              local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish + 1;
            }
            goto LAB_001485a3;
          }
LAB_001485a8:
          operator_delete(local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        else {
LAB_001485a3:
          if (local_48.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) goto LAB_001485a8;
        }
        pvVar3 = (this->prods).
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar8 = pvVar3[uVar10].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar2 = uVar13 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar3[uVar10].
                                                super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                ._M_impl.super__Vector_impl_data + 8) - (long)pPVar8
                                >> 2);
        uVar9 = uVar13;
        uVar13 = (ulong)((int)uVar13 + 1);
      } while (bVar2);
      pvVar4 = (this->prods).
               super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    uVar10 = (ulong)((int)uVar10 + 1);
    uVar9 = ((long)pvVar4 - (long)pvVar3 >> 3) * -0x5555555555555555;
    if (uVar9 < uVar10 || uVar9 - uVar10 == 0) {
      piVar5 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
      iVar6 = *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar11 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar12 = piVar5;
      if (piVar5 == local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ||
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start ==
          local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        *local_70 = iVar6;
      }
      else {
        do {
          if (*piVar12 < iVar6) {
            piVar11 = piVar12;
            iVar6 = *piVar12;
          }
          piVar12 = piVar12 + 1;
        } while (piVar12 !=
                 local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        *local_70 = *piVar11;
        piVar11 = local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        iVar6 = *local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          iVar1 = *piVar5;
          iVar7 = iVar6;
          if (iVar6 <= iVar1) {
            iVar7 = iVar1;
          }
          if (iVar6 < iVar1) {
            piVar11 = piVar5;
          }
          piVar5 = piVar5 + 1;
          iVar6 = iVar7;
        } while (piVar5 != local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        iVar6 = *piVar11;
      }
      *local_50 = iVar6;
      operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
      return;
    }
  } while( true );
}

Assistant:

void get_alphabet_min_and_max(int &min, int &max)
    {
      vector<int> terminals;
      for ( unsigned int vv = 0; vv < prods.size(); vv++ )
      {
        for ( unsigned int ri = 0; ri < prods[vv].size(); ri++ )
        {
          const int r = prods[vv][ri].rule;
          vector<Sym> RHS = rules[r];
          if (RHS.size() == 1 && RHS[0].isTerm())
            terminals.push_back(RHS[0].symID());
        }
      }
      min = *min_element(terminals.begin(), terminals.end());
      max = *max_element(terminals.begin(), terminals.end());
    }